

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O2

bool protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_set
               (protobuf_test_messages_proto2_TestAllTypesProto2 *msg,upb_StringView key,
               upb_StringView val,upb_Arena *a)

{
  upb_MapInsertStatus uVar1;
  upb_Map *map;
  upb_MiniTableField field;
  upb_MiniTableField local_48;
  char *local_38;
  size_t local_30;
  char *local_28;
  size_t local_20;
  
  local_20 = key.size;
  local_28 = key.data;
  local_30 = val.size;
  local_38 = val.data;
  local_48.number_dont_copy_me__upb_internal_use_only = 0x45;
  local_48.offset_dont_copy_me__upb_internal_use_only = 0x260;
  local_48.presence = 0;
  local_48.submsg_index_dont_copy_me__upb_internal_use_only = 0x12;
  local_48.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
  local_48.mode_dont_copy_me__upb_internal_use_only = 0xc0;
  map = _upb_Message_GetOrCreateMutableMap
                  (&msg->base_dont_copy_me__upb_internal_use_only,&local_48,0,0,a);
  uVar1 = _upb_Map_Insert(map,&local_28,0,&local_38,0,a);
  return uVar1 != kUpb_MapInsertStatus_OutOfMemory;
}

Assistant:

UPB_INLINE bool protobuf_test_messages_proto2_TestAllTypesProto2_map_string_string_set(protobuf_test_messages_proto2_TestAllTypesProto2* msg, upb_StringView key, upb_StringView val, upb_Arena* a) {
  const upb_MiniTableField field = {69, UPB_SIZE(200, 608), 0, 18, 11, (int)kUpb_FieldMode_Map | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto2__TestAllTypesProto2__MapStringStringEntry_msg_init);
  upb_Map* map = _upb_Message_GetOrCreateMutableMap(UPB_UPCAST(msg),
                                                    &field, 0, 0, a);
  return _upb_Map_Insert(map, &key, 0, &val, 0, a) !=
         kUpb_MapInsertStatus_OutOfMemory;
}